

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O0

void burstsort_mkq_simpleburst_1(uchar **strings,size_t N)

{
  size_t N_local;
  uchar **strings_local;
  
  burstsort_mkq_simpleburst<unsigned_char>(strings,N);
  return;
}

Assistant:

void burstsort_mkq_simpleburst_1(unsigned char** strings, size_t N)
{ burstsort_mkq_simpleburst<unsigned char>(strings, N); }